

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isGatherOffsetsResultValid<tcu::LookupPrecision,float>
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,int componentNdx,IVec2 (*offsets) [4],Vector<float,_4> *result)

{
  int size;
  int size_00;
  bool bVar1;
  int i_00;
  int j;
  int i;
  int iVar2;
  int iVar3;
  int offNdx;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vector<float,_4> color;
  Vec2 vBounds;
  Vec2 uBounds;
  Vector<float,_4> local_60;
  tcu local_50 [16];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar5 = floorf(local_38 + -0.5);
  fVar6 = floorf(local_34 + -0.5);
  fVar7 = floorf(local_40 + -0.5);
  fVar8 = floorf(local_3c + -0.5);
  size = (level->m_size).m_data[0];
  size_00 = (level->m_size).m_data[1];
  for (iVar2 = (int)fVar7; iVar3 = (int)fVar5, iVar2 <= (int)fVar8; iVar2 = iVar2 + 1) {
    while (iVar3 <= (int)fVar6) {
      Vector<float,_4>::Vector(&local_60);
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        i_00 = TexVerifierUtil::wrap(sampler->wrapS,(*offsets)[lVar4].m_data[0] + iVar3,size);
        j = TexVerifierUtil::wrap(sampler->wrapT,(*offsets)[lVar4].m_data[1] + iVar2,size_00);
        lookup<float>(local_50,level,sampler,i_00,j,coordZ);
        local_60.m_data[lVar4] = *(float *)(local_50 + (long)componentNdx * 4);
      }
      bVar1 = isColorValid(prec,&local_60,result);
      iVar3 = iVar3 + 1;
      if (bVar1) goto LAB_00936c4f;
    }
  }
LAB_00936c4f:
  return iVar2 <= (int)fVar8;
}

Assistant:

static bool isGatherOffsetsResultValid (const ConstPixelBufferAccess&	level,
										const Sampler&					sampler,
										const PrecType&					prec,
										const Vec2&						coord,
										int								coordZ,
										int								componentNdx,
										const IVec2						(&offsets)[4],
										const Vector<ScalarType, 4>&	result)
{
	const Vec2	uBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(), coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			Vector<ScalarType, 4> color;
			for (int offNdx = 0; offNdx < 4; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int x = wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int y = wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				color[offNdx] = lookup<ScalarType>(level, sampler, x, y, coordZ)[componentNdx];
			}

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}